

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&> *
testing::internal::
MatcherCastImpl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>_>
::Cast(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
       *__return_storage_ptr__,
      PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *polymorphic_matcher_or_value)

{
  linked_ptr_internal lVar1;
  linked_ptr<const_testing::internal::RE> local_28;
  undefined1 local_18;
  
  local_28.value_ = (polymorphic_matcher_or_value->impl_).regex_.value_;
  lVar1.next_ = &local_28.link_;
  if (local_28.value_ != (RE *)0x0) {
    linked_ptr_internal::join(&local_28.link_,&(polymorphic_matcher_or_value->impl_).regex_.link_);
    lVar1.next_ = local_28.link_.next_;
  }
  local_28.link_.next_ = lVar1.next_;
  local_18 = (polymorphic_matcher_or_value->impl_).full_match_;
  PolymorphicMatcher::operator_cast_to_Matcher
            (__return_storage_ptr__,(PolymorphicMatcher *)&local_28);
  linked_ptr<const_testing::internal::RE>::depart(&local_28);
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> Cast(M polymorphic_matcher_or_value) {
    // M can be a polymorhic matcher, in which case we want to use
    // its conversion operator to create Matcher<T>.  Or it can be a value
    // that should be passed to the Matcher<T>'s constructor.
    //
    // We can't call Matcher<T>(polymorphic_matcher_or_value) when M is a
    // polymorphic matcher because it'll be ambiguous if T has an implicit
    // constructor from M (this usually happens when T has an implicit
    // constructor from any type).
    //
    // It won't work to unconditionally implict_cast
    // polymorphic_matcher_or_value to Matcher<T> because it won't trigger
    // a user-defined conversion from M to T if one exists (assuming M is
    // a value).
    return CastImpl(
        polymorphic_matcher_or_value,
        BooleanConstant<
            internal::ImplicitlyConvertible<M, Matcher<T> >::value>());
  }